

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t readn(int fd,string *inBuffer,bool *zero)

{
  int *piVar1;
  undefined1 *in_RDX;
  int in_EDI;
  char buff [4096];
  ssize_t readSum;
  ssize_t nread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> *__a;
  char *in_stack_ffffffffffffef90;
  char *in_stack_ffffffffffffef98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038 [128];
  long local_30;
  ssize_t local_28;
  undefined1 *local_20;
  int local_c;
  long local_8;
  
  local_28 = 0;
  local_30 = 0;
  local_20 = in_RDX;
  local_c = in_EDI;
  while( true ) {
    while (local_28 = read(local_c,local_1038,0x1000), local_28 < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        piVar1 = __errno_location();
        if (*piVar1 == 0xb) {
          local_8 = local_30;
        }
        else {
          perror("read error");
          local_8 = -1;
        }
        return local_8;
      }
    }
    if (local_28 == 0) break;
    local_30 = local_30 + local_28;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_1038[0]._M_dataplus._M_p + local_28);
    __a = (allocator<char> *)&stack0xffffffffffffefa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>
              (in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,__a);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,in_stack_ffffffffffffef78);
    std::__cxx11::string::~string(this);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffefa7);
  }
  *local_20 = 1;
  return local_30;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer, bool &zero){
    ssize_t nread=0;
    ssize_t readSum=0;

    while (true) {
        char buff[MAX_BUFF];
        if((nread=read(fd, buff, MAX_BUFF))<0){
            if(errno==EINTR){
                continue;;
            }else if (errno==EAGAIN) {
                return readSum;
            }else {
                perror("read error");
                return -1;
            }
        }else if (nread==0) {
            zero=true;
            break;
        }
        // printf("before inBuffer.size() = %d\n", inBuffer.size());
        // printf("nread = %d\n", nread);
        readSum+=nread;
        // buff += nread;
        inBuffer+=std::string(buff,buff+nread);
        // printf("after inBuffer.size() = %d\n", inBuffer.size());
    }
    return readSum;
}